

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall kratos::DebugInfoVisitor::visit(DebugInfoVisitor *this,Port *var)

{
  Port *var_local;
  DebugInfoVisitor *this_local;
  
  add_info(this,&var->super_Var);
  return;
}

Assistant:

void visit(Port *var) override { add_info(var); }